

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ShowVarsTask::checkArguments
          (ShowVarsTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  pointer ppEVar2;
  size_t sVar3;
  Expression *this_00;
  bool bVar4;
  Symbol *pSVar5;
  long lVar6;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,0,0x7fffffff);
  lVar6 = 400;
  if (bVar4) {
    ppEVar2 = args->_M_ptr;
    sVar3 = (args->_M_extent)._M_extent_value;
    lVar6 = 0;
    do {
      if (sVar3 << 3 == lVar6) {
        lVar6 = 0x188;
        goto LAB_004272c5;
      }
      this_00 = *(Expression **)((long)ppEVar2 + lVar6);
      pSVar5 = Expression::getSymbolReference(this_00,true);
    } while ((pSVar5 != (Symbol *)0x0) && (lVar6 = lVar6 + 8, pSVar5->kind - Net < 2));
    bVar4 = Scope::isUninstantiated((context->scope).ptr);
    if (!bVar4) {
      ASTContext::addDiag(context,(DiagCode)0xf000b,this_00->sourceRange);
    }
    lVar6 = 400;
  }
LAB_004272c5:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar6);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        for (auto arg : args) {
            auto sym = arg->getSymbolReference();
            if (!sym || (sym->kind != SymbolKind::Variable && sym->kind != SymbolKind::Net)) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedVariableName, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }